

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O1

void mp::
     WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               vector<double,_std::allocator<double>_> *v)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  double *pdVar3;
  char *pcVar4;
  ulong uVar5;
  double *el;
  double *pdVar6;
  int iVar7;
  bool bVar8;
  FormatSpec local_48;
  
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '[';
  pdVar6 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (v->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar6 != pdVar3) {
    iVar7 = 0;
    do {
      bVar8 = iVar7 != 0;
      iVar7 = iVar7 + -1;
      if (bVar8) {
        pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
        uVar5 = pBVar1->size_ + 2;
        if (pBVar1->capacity_ < uVar5) {
          (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
        }
        pcVar4 = pBVar1->ptr_;
        sVar2 = pBVar1->size_;
        (pcVar4 + sVar2)[0] = ',';
        (pcVar4 + sVar2)[1] = ' ';
        pBVar1->size_ = uVar5;
      }
      local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
      local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
      local_48.flags_ = 0;
      local_48.precision_ = -1;
      local_48.type_ = '\0';
      fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,*pdVar6,&local_48);
      pdVar6 = pdVar6 + 1;
    } while (pdVar6 != pdVar3);
  }
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ']';
  return;
}

Assistant:

void WriteModelItemParameters(
    Writer& wrt, const Vec& v) {
  wrt << '[';
  int n=-1;
  for (const auto& el: v) {
    if (++n)
      wrt << ", ";
    wrt << el;
  }
  wrt << ']';
}